

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWriteModelIntStruct(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover,char *pStr)

{
  word wVar1;
  word *pwVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  word (*pawVar7) [1024];
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int nLutLeaf;
  int iVar12;
  int iVar13;
  long lVar14;
  int nLutRoot;
  word Func1;
  word Func0;
  word Func2;
  char pLut2 [32];
  char pLut1 [32];
  char pLut0 [32];
  word pRes [1024];
  word pCube [1024];
  
  uVar3 = (pNode->vFanins).nSize;
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".model m%d\n",(ulong)(uint)pNode->Id);
  fwrite(".inputs",7,1,(FILE *)pFile);
  for (iVar12 = 0; iVar12 < (pNode->vFanins).nSize; iVar12 = iVar12 + 1) {
    fprintf((FILE *)pFile," %c",(ulong)(iVar12 + 0x61));
  }
  fputc(10,(FILE *)pFile);
  fwrite(".outputs o\n",0xb,1,(FILE *)pFile);
  sVar4 = strlen(pStr);
  iVar12 = (int)sVar4;
  if (iVar12 - 4U < 0xfffffffe) {
    printf("Wrong LUT struct (%s)\n",pStr);
    return;
  }
  uVar6 = 0;
  while ((sVar4 & 0xffffffff) != uVar6) {
    pcVar5 = pStr + uVar6;
    uVar6 = uVar6 + 1;
    if ((byte)(*pcVar5 - 0x37U) < 0xfc) {
      printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)*pcVar5 - 0x30));
      return;
    }
  }
  iVar13 = 0;
  if (iVar12 == 3) {
    iVar13 = pStr[1] + -0x30;
  }
  iVar8 = iVar13 + -1;
  if (iVar13 == 0) {
    iVar8 = 0;
  }
  if ((int)pStr[iVar12 - 1] + iVar8 + *pStr + -0x61 < (int)uVar3) {
    printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)uVar3,pStr);
    return;
  }
  nLutLeaf = *pStr + -0x30;
  nLutRoot = pStr[iVar12 - 1] + -0x30;
  iVar8 = nLutRoot;
  if (nLutRoot < nLutLeaf) {
    iVar8 = nLutLeaf;
  }
  if (iVar8 < iVar13) {
    iVar8 = iVar13;
  }
  if ((int)uVar3 <= iVar8) {
    fwrite(".names",6,1,(FILE *)pFile);
    for (iVar12 = 0; iVar12 < (pNode->vFanins).nSize; iVar12 = iVar12 + 1) {
      fprintf((FILE *)pFile," %c",(ulong)(iVar12 + 0x61));
    }
    fprintf((FILE *)pFile," %s\n","o");
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    fwrite(".end\n",5,1,(FILE *)pFile);
    return;
  }
  pLut2[0x10] = '\0';
  pLut2[0x11] = '\0';
  pLut2[0x12] = '\0';
  pLut2[0x13] = '\0';
  pLut2[0x14] = '\0';
  pLut2[0x15] = '\0';
  pLut2[0x16] = '\0';
  pLut2[0x17] = '\0';
  pLut2[0x18] = '\0';
  pLut2[0x19] = '\0';
  pLut2[0x1a] = '\0';
  pLut2[0x1b] = '\0';
  pLut2[0x1c] = '\0';
  pLut2[0x1d] = '\0';
  pLut2[0x1e] = '\0';
  pLut2[0x1f] = '\0';
  pLut2[0] = '\0';
  pLut2[1] = '\0';
  pLut2[2] = '\0';
  pLut2[3] = '\0';
  pLut2[4] = '\0';
  pLut2[5] = '\0';
  pLut2[6] = '\0';
  pLut2[7] = '\0';
  pLut2[8] = '\0';
  pLut2[9] = '\0';
  pLut2[10] = '\0';
  pLut2[0xb] = '\0';
  pLut2[0xc] = '\0';
  pLut2[0xd] = '\0';
  pLut2[0xe] = '\0';
  pLut2[0xf] = '\0';
  if (Io_NtkWriteModelIntStruct::TruthStore[0][0] == 0) {
    lVar14 = 6;
    pawVar7 = Io_NtkWriteModelIntStruct::TruthStore;
    for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 8) {
      *(word (**) [1024])((long)Io_NtkWriteModelIntStruct::pTruths + lVar10) = pawVar7;
      pawVar7 = pawVar7 + 1;
    }
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      wVar1 = Io_NtkWriteNodeIntStruct::Truth6[lVar10];
      pwVar2 = Io_NtkWriteModelIntStruct::pTruths[lVar10];
      for (lVar11 = 0; lVar11 != 0x400; lVar11 = lVar11 + 1) {
        pwVar2[lVar11] = wVar1;
      }
    }
    for (; lVar14 != 0x10; lVar14 = lVar14 + 1) {
      pwVar2 = Io_NtkWriteModelIntStruct::pTruths[lVar14];
      for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 1) {
        pwVar2[lVar10] = -(ulong)((1 << ((char)lVar14 - 6U & 0x1f) & (uint)lVar10) != 0);
      }
    }
  }
  Abc_SopToTruthBig((char *)(pNode->field_5).pData,uVar3,Io_NtkWriteModelIntStruct::pTruths,pCube,
                    pRes);
  iVar8 = Kit_TruthIsConst0((uint *)pRes,uVar3);
  if ((iVar8 == 0) && (iVar8 = Kit_TruthIsConst1((uint *)pRes,uVar3), iVar8 == 0)) {
    if (iVar12 == 2) {
      iVar13 = If_CluCheckExt((void *)0x0,pRes,uVar3,nLutLeaf,nLutRoot,pLut0,pLut1,&Func0,&Func1);
      if (iVar13 == 0) {
        Extra_PrintHex(_stdout,(uint *)pRes,uVar3);
        printf("    ");
LAB_002e6061:
        Kit_DsdPrintFromTruth((uint *)pRes,uVar3);
        putchar(10);
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar5);
        return;
      }
    }
    else {
      iVar13 = If_CluCheckExt3((void *)0x0,pRes,uVar3,nLutLeaf,iVar13,nLutRoot,pLut0,pLut1,pLut2,
                               &Func0,&Func1,&Func2);
      if (iVar13 == 0) {
        Extra_PrintHex(_stdout,(uint *)pRes,uVar3);
        printf("    ");
        goto LAB_002e6061;
      }
    }
    fwrite(".names",6,1,(FILE *)pFile);
    for (lVar14 = 0; lVar14 < pLut1[0]; lVar14 = lVar14 + 1) {
      fprintf((FILE *)pFile," %c",(ulong)((int)pLut1[lVar14 + 2] + 0x61));
    }
    fwrite(" lut1\n",6,1,(FILE *)pFile);
    pcVar5 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func1,(int)pLut1[0],vCover);
    fputs(pcVar5,(FILE *)pFile);
    if ((iVar12 == 3) && ('\0' < pLut2[0])) {
      fwrite(".names",6,1,(FILE *)pFile);
      for (lVar14 = 0; lVar14 < pLut2[0]; lVar14 = lVar14 + 1) {
        if (uVar3 == (int)pLut2[lVar14 + 2]) {
          fwrite(" lut1",5,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile," %c",(ulong)((int)pLut2[lVar14 + 2] + 0x61));
        }
      }
      fwrite(" lut2\n",6,1,(FILE *)pFile);
      pcVar5 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func2,(int)pLut2[0],vCover);
      fputs(pcVar5,(FILE *)pFile);
    }
    fwrite(".names",6,1,(FILE *)pFile);
    for (lVar14 = 0; lVar14 < pLut0[0]; lVar14 = lVar14 + 1) {
      uVar9 = (uint)pLut0[lVar14 + 2];
      if (uVar3 == uVar9) {
        pcVar5 = " lut1";
LAB_002e5fbf:
        fwrite(pcVar5,5,1,(FILE *)pFile);
      }
      else {
        if (uVar3 + 1 == uVar9) {
          pcVar5 = " lut2";
          goto LAB_002e5fbf;
        }
        fprintf((FILE *)pFile," %c",(ulong)(uVar9 + 0x61));
      }
    }
    fprintf((FILE *)pFile," %s\n","o");
    pcVar5 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func0,(int)pLut0[0],vCover);
    fputs(pcVar5,(FILE *)pFile);
  }
  else {
    uVar3 = Kit_TruthIsConst1((uint *)pRes,uVar3);
    fprintf((FILE *)pFile,".names %s\n %d\n","o",(ulong)uVar3);
  }
  fwrite(".end\n",5,1,(FILE *)pFile);
  return;
}

Assistant:

void Io_NtkWriteModelIntStruct( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover, char * pStr )
{
    Abc_Obj_t * pNet;
    int nLeaves = Abc_ObjFaninNum(pNode);
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;

    // write the header
    fprintf( pFile, "\n" );
    fprintf( pFile, ".model m%d\n", Abc_ObjId(pNode) );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        fprintf( pFile, " %c", 'a' + i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return;
    }

    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %c", 'a' + i );
        // get the output name
        fprintf( pFile, " %s\n", "o" );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
        fprintf( pFile, ".end\n" );
        return;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word pCube[1<<10], pRes[1<<10], Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0}, * pSop;
//        int nVarsMin[3], pVars[3][20];

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                ABC_CONST(0xAAAAAAAAAAAAAAAA),
                ABC_CONST(0xCCCCCCCCCCCCCCCC),
                ABC_CONST(0xF0F0F0F0F0F0F0F0),
                ABC_CONST(0xFF00FF00FF00FF00),
                ABC_CONST(0xFFFF0000FFFF0000),
                ABC_CONST(0xFFFFFFFF00000000)
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }

        // collect variables
//        Abc_ObjForEachFanin( pNode, pNet, i )
//            pVars[0][i] = pVars[1][i] = pVars[2][i] = i;

        // derive truth table
        Abc_SopToTruthBig( (char*)Abc_ObjData(pNode), nLeaves, pTruths, pCube, pRes );
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
            fprintf( pFile, ".names %s\n %d\n", "o", Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            fprintf( pFile, ".end\n" );
            return;
        }

//        Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
//        Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );

        // perform decomposition
        if ( Length == 2 )
        {
            if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }
        else
        {
            if ( !If_CluCheckExt3( NULL, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }

        // write leaf node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut1[0]; i++ )
            fprintf( pFile, " %c", 'a' + pLut1[2+i] );
        fprintf( pFile, " lut1\n" );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func1, pLut1[0], vCover );
        fprintf( pFile, "%s", pSop );

        if ( Length == 3 && pLut2[0] > 0 )
        {
            // write leaf node
            fprintf( pFile, ".names" );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    fprintf( pFile, " lut1" );
                else
                    fprintf( pFile, " %c", 'a' + pLut2[2+i] );
            fprintf( pFile, " lut2\n" );
            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func2, pLut2[0], vCover );
            fprintf( pFile, "%s", pSop );
        }

        // write root node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                fprintf( pFile, " lut1" );
            else if ( pLut0[2+i] == nLeaves+1 )
                fprintf( pFile, " lut2" );
            else
                fprintf( pFile, " %c", 'a' + pLut0[2+i] );
        fprintf( pFile, " %s\n", "o" );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func0, pLut0[0], vCover );
        fprintf( pFile, "%s", pSop );
        fprintf( pFile, ".end\n" );
    }
}